

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NeuralNetworkLayer::set_allocated_broadcasttostatic
          (NeuralNetworkLayer *this,BroadcastToStaticLayerParams *broadcasttostatic)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_layer(this);
  if (broadcasttostatic != (BroadcastToStaticLayerParams *)0x0) {
    submessage_arena = (Arena *)(broadcasttostatic->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      broadcasttostatic =
           (BroadcastToStaticLayerParams *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&broadcasttostatic->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x451;
    (this->layer_).broadcasttostatic_ = broadcasttostatic;
  }
  return;
}

Assistant:

void NeuralNetworkLayer::set_allocated_broadcasttostatic(::CoreML::Specification::BroadcastToStaticLayerParams* broadcasttostatic) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_layer();
  if (broadcasttostatic) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::BroadcastToStaticLayerParams>::GetOwningArena(broadcasttostatic);
    if (message_arena != submessage_arena) {
      broadcasttostatic = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, broadcasttostatic, submessage_arena);
    }
    set_has_broadcasttostatic();
    layer_.broadcasttostatic_ = broadcasttostatic;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.NeuralNetworkLayer.broadcastToStatic)
}